

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParams(ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
               unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_compressionParameters cPar;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  ZSTD_compressionParameters *pZVar6;
  ulong local_70;
  ZSTD_compressionParameters cp;
  int row;
  U32 tableID;
  U64 rSize;
  size_t addedSize;
  size_t dictSize_local;
  unsigned_long_long srcSizeHint_local;
  int compressionLevel_local;
  
  iVar5 = 500;
  if (srcSizeHint != 0) {
    iVar5 = 0;
  }
  if (srcSizeHint + dictSize == 0) {
    local_70 = 0xffffffffffffffff;
  }
  else {
    local_70 = srcSizeHint + dictSize + (long)iVar5;
  }
  cp.strategy = compressionLevel;
  if (compressionLevel == 0) {
    cp.strategy = ZSTD_greedy;
  }
  if (compressionLevel < 0) {
    cp.strategy = 0;
  }
  if (0x16 < compressionLevel) {
    cp.strategy = 0x16;
  }
  pZVar6 = ZSTD_defaultCParameters
           [(uint)(local_70 < 0x40001) + (uint)(local_70 < 0x20001) + (uint)(local_70 < 0x4001)] +
           (int)cp.strategy;
  uVar1 = pZVar6->windowLog;
  uVar2 = pZVar6->chainLog;
  uVar3 = pZVar6->hashLog;
  uVar4 = pZVar6->searchLog;
  cPar.searchLog = uVar4;
  cPar.hashLog = uVar3;
  cPar.chainLog = uVar2;
  cPar.windowLog = uVar1;
  cp.hashLog = pZVar6->minMatch;
  cp.searchLog = pZVar6->targetLength;
  if (compressionLevel < 0) {
    cp.searchLog = -compressionLevel;
  }
  cPar.minMatch = cp.hashLog;
  cPar.targetLength = cp.searchLog;
  cPar.strategy = pZVar6->strategy;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParams(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize)
{
    size_t const addedSize = srcSizeHint ? 0 : 500;
    U64 const rSize = srcSizeHint+dictSize ? srcSizeHint+dictSize+addedSize : (U64)-1;
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);   /* intentional underflow for srcSizeHint == 0 */
    int row = compressionLevel;
    DEBUGLOG(5, "ZSTD_getCParams (cLevel=%i)", compressionLevel);
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        if (compressionLevel < 0) cp.targetLength = (unsigned)(-compressionLevel);   /* acceleration factor */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize);
    }
}